

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::find_or_prepare_insert_non_soo<int>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *this,int *key)

{
  byte *pbVar1;
  PolicyFunctions *pPVar2;
  ulong uVar3;
  long lVar4;
  ctrl_t *pcVar5;
  uint uVar6;
  ushort uVar7;
  undefined1 uVar8;
  bool bVar9;
  size_t sVar10;
  uint uVar11;
  ctrl_t *pcVar12;
  ushort uVar13;
  PolicyFunctions *policy;
  bool bVar14;
  ulong uVar15;
  anon_union_8_1_a8a14541_for_iterator_2 aVar16;
  ulong uVar17;
  CommonFields *common;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  __m128i match;
  FindInfo target;
  ulong local_68;
  byte bVar20;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  
  pPVar2 = (PolicyFunctions *)
           (this->settings_).
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           heap_or_soo_.heap.control;
  uVar3 = (this->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_;
  if ((uVar3 + 1 & uVar3) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar17 = ((ulong)(uint)*key ^ (ulong)&hash_internal::MixingHashState::kSeed) * -0x234dd359734ecb13
  ;
  common = (CommonFields *)
           (uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 | (uVar17 & 0xff0000000000) >> 0x18
            | (uVar17 & 0xff00000000) >> 8 | (uVar17 & 0xff000000) << 8 |
            (uVar17 & 0xff0000) << 0x18 | (uVar17 & 0xff00) << 0x28 | uVar17 << 0x38);
  uVar15 = ((ulong)common >> 7 ^ (ulong)pPVar2 >> 0xc) & uVar3;
  uVar8 = (undefined1)(uVar17 >> 0x38);
  auVar18 = ZEXT216(CONCAT11(uVar8,uVar8) & 0x7f7f);
  auVar18 = pshuflw(auVar18,auVar18,0);
  pcVar12 = (__return_storage_ptr__->first).ctrl_;
  aVar16 = (__return_storage_ptr__->first).field_1;
  bVar14 = __return_storage_ptr__->second;
  local_68 = 0;
  do {
    pbVar1 = (byte *)((long)&pPVar2->slot_size + uVar15);
    bVar20 = auVar18[0];
    auVar21[0] = -(bVar20 == *pbVar1);
    bVar22 = auVar18[1];
    auVar21[1] = -(bVar22 == pbVar1[1]);
    bVar23 = auVar18[2];
    auVar21[2] = -(bVar23 == pbVar1[2]);
    bVar24 = auVar18[3];
    auVar21[3] = -(bVar24 == pbVar1[3]);
    auVar21[4] = -(bVar20 == pbVar1[4]);
    auVar21[5] = -(bVar22 == pbVar1[5]);
    auVar21[6] = -(bVar23 == pbVar1[6]);
    auVar21[7] = -(bVar24 == pbVar1[7]);
    auVar21[8] = -(bVar20 == pbVar1[8]);
    auVar21[9] = -(bVar22 == pbVar1[9]);
    auVar21[10] = -(bVar23 == pbVar1[10]);
    auVar21[0xb] = -(bVar24 == pbVar1[0xb]);
    auVar21[0xc] = -(bVar20 == pbVar1[0xc]);
    auVar21[0xd] = -(bVar22 == pbVar1[0xd]);
    auVar21[0xe] = -(bVar23 == pbVar1[0xe]);
    auVar21[0xf] = -(bVar24 == pbVar1[0xf]);
    uVar13 = (ushort)(SUB161(auVar21 >> 7,0) & 1) | (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe | (ushort)(auVar21[0xf] >> 7) << 0xf;
    uVar11 = (uint)uVar13;
    if (uVar13 != 0) {
      lVar4 = *(long *)((long)&(this->settings_).
                               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                               .
                               super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                               .value.heap_or_soo_ + 8);
      do {
        uVar6 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
          }
        }
        uVar17 = uVar6 + uVar15 & uVar3;
        if (*(int *)(lVar4 + uVar17 * 0x28) == *key) {
          (__return_storage_ptr__->first).field_1 = aVar16;
          __return_storage_ptr__->second = bVar14;
          (__return_storage_ptr__->first).ctrl_ = pcVar12;
          pcVar12 = (this->settings_).
                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                    .value.heap_or_soo_.heap.control;
          if (pcVar12 != (ctrl_t *)0x0) {
            (__return_storage_ptr__->first).ctrl_ = pcVar12 + uVar17;
            (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(lVar4 + uVar17 * 0x28);
            __return_storage_ptr__->second = false;
            return __return_storage_ptr__;
          }
          goto LAB_0019ce3a;
        }
        uVar13 = (ushort)(uVar11 - 1) & (ushort)uVar11;
        uVar11 = CONCAT22((short)(uVar11 - 1 >> 0x10),uVar13);
      } while (uVar13 != 0);
    }
    auVar19[0] = -(*pbVar1 == 0x80);
    auVar19[1] = -(pbVar1[1] == 0x80);
    auVar19[2] = -(pbVar1[2] == 0x80);
    auVar19[3] = -(pbVar1[3] == 0x80);
    auVar19[4] = -(pbVar1[4] == 0x80);
    auVar19[5] = -(pbVar1[5] == 0x80);
    auVar19[6] = -(pbVar1[6] == 0x80);
    auVar19[7] = -(pbVar1[7] == 0x80);
    auVar19[8] = -(pbVar1[8] == 0x80);
    auVar19[9] = -(pbVar1[9] == 0x80);
    auVar19[10] = -(pbVar1[10] == 0x80);
    auVar19[0xb] = -(pbVar1[0xb] == 0x80);
    auVar19[0xc] = -(pbVar1[0xc] == 0x80);
    auVar19[0xd] = -(pbVar1[0xd] == 0x80);
    auVar19[0xe] = -(pbVar1[0xe] == 0x80);
    auVar19[0xf] = -(pbVar1[0xf] == 0x80);
    uVar13 = (ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe | (ushort)(auVar19[0xf] >> 7) << 0xf;
    if (uVar13 == 0) {
      if ((this->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_ < local_68 + 0x10) {
        (__return_storage_ptr__->first).field_1 = aVar16;
        __return_storage_ptr__->second = bVar14;
        (__return_storage_ptr__->first).ctrl_ = pcVar12;
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf7d,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, std::basic_string<char>>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, std::basic_string<char>>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<int, std::basic_string<char>>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, std::basic_string<char>>>, K = int]"
                     );
      }
      uVar15 = uVar15 + local_68 + 0x10 & uVar3;
      local_68 = local_68 + 0x10;
    }
    else {
      policy = pPVar2;
      bVar9 = ShouldInsertBackwardsForDebug
                        ((this->settings_).
                         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                         .
                         super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                         .value.capacity_,(size_t)common,
                         (this->settings_).
                         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                         .
                         super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                         .value.heap_or_soo_.heap.control);
      if (bVar9) {
        uVar7 = 0xf;
        if (uVar13 != 0) {
          for (; uVar13 >> uVar7 == 0; uVar7 = uVar7 - 1) {
          }
        }
        uVar11 = (ushort)((uVar7 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar11 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
          }
        }
      }
      target.probe_length =
           (size_t)raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,std::__cxx11::string>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                   ::GetPolicyFunctions()::value;
      target.offset = local_68;
      sVar10 = PrepareInsertNonSoo((container_internal *)this,common,uVar11 + uVar15 & uVar3,target,
                                   policy);
      pcVar5 = (this->settings_).
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.heap_or_soo_.heap.control;
      if (pcVar5 == (ctrl_t *)0x0) {
        (__return_storage_ptr__->first).field_1 = aVar16;
        __return_storage_ptr__->second = bVar14;
        (__return_storage_ptr__->first).ctrl_ = pcVar12;
LAB_0019ce3a:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9ef,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, std::basic_string<char>>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, std::basic_string<char>>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<int, std::basic_string<char>>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, std::basic_string<char>>>]"
                     );
      }
      pcVar12 = pcVar5 + sVar10;
      aVar16.slot_ = (slot_type *)
                     (sVar10 * 0x28 +
                     (long)(this->settings_).
                           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                           .
                           super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                           .value.heap_or_soo_.heap.slot_array.p);
      bVar14 = true;
    }
    if (uVar13 != 0) {
      (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)aVar16;
      __return_storage_ptr__->second = bVar14;
      (__return_storage_ptr__->first).ctrl_ = pcVar12;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

ctrl_t* control() const {
    ABSL_SWISSTABLE_IGNORE_UNINITIALIZED_RETURN(heap.control);
  }